

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdpeer.cc
# Opt level: O1

int __thiscall bdSpace::scanOutOfDatePeers(bdSpace *this,list<bdId,_std::allocator<bdId>_> *peerIds)

{
  size_t *psVar1;
  uint32_t uVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  size_t sVar7;
  bool bVar8;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  long lVar11;
  iterator __ret;
  uint32_t uVar12;
  pointer pbVar13;
  map<bdMetric,_bdId,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdId>_>_>
  closest;
  _Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdId>,_std::_Select1st<std::pair<const_bdMetric,_bdId>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdId>_>_>
  local_60;
  
  uVar2 = this->mAttachedCount;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar12 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = (_List_node_base *)time((time_t *)0x0);
  pbVar13 = (this->buckets).super__Vector_base<bdBucket,_std::allocator<bdBucket>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pbVar13 !=
      (this->buckets).super__Vector_base<bdBucket,_std::allocator<bdBucket>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar12 = 0;
    do {
      p_Var3 = (pbVar13->entries).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node.
               super__List_node_base._M_next;
      while (p_Var6 = p_Var3, p_Var6 != (_List_node_base *)pbVar13) {
        if ((uVar2 == 0) || ((*(byte *)&((pointer)((long)(p_Var6 + 4) + 0x10))->entries & 2) == 0))
        {
          bVar8 = false;
        }
        else {
          if (((long)p_Var9 -
               (long)(((pointer)(p_Var6 + 3))->entries).
                     super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node.
                     super__List_node_base._M_prev < 0x12) ||
             ((long)((long)p_Var9 -
                    (((pointer)(p_Var6 + 3))->entries).
                    super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node._M_size) <
              0x12)) {
            bVar8 = false;
          }
          else {
            p_Var10 = (_List_node_base *)operator_new(0x38);
            *(undefined4 *)&p_Var10[3]._M_next =
                 *(undefined4 *)
                  &(((pointer)(p_Var6 + 3))->entries).
                   super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node.
                   super__List_node_base._M_next;
            p_Var3 = *(_List_node_base **)
                      &((list<bdPeer,_std::allocator<bdPeer>_> *)(p_Var6 + 1))->
                       super__List_base<bdPeer,_std::allocator<bdPeer>_>;
            p_Var4 = *(_List_node_base **)&((pointer)((long)(p_Var6 + 1) + 8))->entries;
            p_Var5 = *(_List_node_base **)&((pointer)((long)(p_Var6 + 1) + 0x18))->entries;
            p_Var10[2]._M_next =
                 *(_List_node_base **)&((pointer)((long)(p_Var6 + 1) + 0x10))->entries;
            p_Var10[2]._M_prev = p_Var5;
            p_Var10[1]._M_next = p_Var3;
            p_Var10[1]._M_prev = p_Var4;
            std::__detail::_List_node_base::_M_hook(p_Var10);
            psVar1 = &(peerIds->super__List_base<bdId,_std::allocator<bdId>_>)._M_impl._M_node.
                      _M_size;
            *psVar1 = *psVar1 + 1;
            (((pointer)(p_Var6 + 3))->entries).super__List_base<bdPeer,_std::allocator<bdPeer>_>.
            _M_impl._M_node.super__List_node_base._M_prev = p_Var9;
            bVar8 = true;
          }
          uVar12 = uVar12 + 1;
        }
        if (((!bVar8) &&
            (300 < (long)p_Var9 -
                   (long)(((pointer)(p_Var6 + 3))->entries).
                         super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node.
                         super__List_node_base._M_prev)) &&
           ((300 < (long)((long)p_Var9 -
                         (((pointer)(p_Var6 + 3))->entries).
                         super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node._M_size)
            || (((ulong)(((pointer)(p_Var6 + 3))->entries).
                        super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node.
                        super__List_node_base._M_next & 0x200000000) == 0)))) {
          p_Var10 = (_List_node_base *)operator_new(0x38);
          *(undefined4 *)&p_Var10[3]._M_next =
               *(undefined4 *)
                &(((pointer)(p_Var6 + 3))->entries).
                 super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node.
                 super__List_node_base._M_next;
          p_Var3 = *(_List_node_base **)
                    &((list<bdPeer,_std::allocator<bdPeer>_> *)(p_Var6 + 1))->
                     super__List_base<bdPeer,_std::allocator<bdPeer>_>;
          p_Var4 = *(_List_node_base **)&((pointer)((long)(p_Var6 + 1) + 8))->entries;
          p_Var5 = *(_List_node_base **)&((pointer)((long)(p_Var6 + 1) + 0x18))->entries;
          p_Var10[2]._M_next = *(_List_node_base **)&((pointer)((long)(p_Var6 + 1) + 0x10))->entries
          ;
          p_Var10[2]._M_prev = p_Var5;
          p_Var10[1]._M_next = p_Var3;
          p_Var10[1]._M_prev = p_Var4;
          std::__detail::_List_node_base::_M_hook(p_Var10);
          psVar1 = &(peerIds->super__List_base<bdId,_std::allocator<bdId>_>)._M_impl._M_node._M_size
          ;
          *psVar1 = *psVar1 + 1;
          (((pointer)(p_Var6 + 3))->entries).super__List_base<bdPeer,_std::allocator<bdPeer>_>.
          _M_impl._M_node.super__List_node_base._M_prev = p_Var9;
        }
        lVar11 = (long)p_Var9 -
                 (((pointer)(p_Var6 + 3))->entries).
                 super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node._M_size;
        bVar8 = 0x267 < lVar11;
        if (0xf < (long)p_Var9 -
                  (long)*(_List_node_base **)&((pointer)((long)(p_Var6 + 4) + 8))->entries) {
          bVar8 = ((ulong)(((pointer)(p_Var6 + 3))->entries).
                          super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node.
                          super__List_node_base._M_next & 0x200000000) == 0 || 0x267 < lVar11;
        }
        p_Var3 = (((list<bdPeer,_std::allocator<bdPeer>_> *)&p_Var6->_M_next)->
                 super__List_base<bdPeer,_std::allocator<bdPeer>_>)._M_impl._M_node.
                 super__List_node_base._M_next;
        if (bVar8) {
          psVar1 = &(pbVar13->entries).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl.
                    _M_node._M_size;
          *psVar1 = *psVar1 - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var6,0x58);
        }
      }
      pbVar13 = pbVar13 + 1;
    } while (pbVar13 !=
             (this->buckets).super__Vector_base<bdBucket,_std::allocator<bdBucket>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if ((600 < (long)p_Var9 - this->mAttachTS) || (uVar12 != this->mAttachedCount)) {
    updateAttachedPeers(this);
    this->mAttachTS = (time_t)p_Var9;
  }
  sVar7 = (peerIds->super__List_base<bdId,_std::allocator<bdId>_>)._M_impl._M_node._M_size;
  std::
  _Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdId>,_std::_Select1st<std::pair<const_bdMetric,_bdId>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdId>_>_>
  ::~_Rb_tree(&local_60);
  return (int)sVar7;
}

Assistant:

int	bdSpace::scanOutOfDatePeers(std::list<bdId> &peerIds) {
	/* 
	 * 
	 */
	bool doAttached = (mAttachedCount > 0);
	uint32_t attachedCount = 0;

	std::map<bdMetric, bdId> closest;
	std::map<bdMetric, bdId>::iterator mit;

	std::vector<bdBucket>::iterator it;
	std::list<bdPeer>::iterator eit;
	time_t ts = time(NULL);

	/* iterate through the buckets, and sort by distance */
	for (it = buckets.begin(); it != buckets.end(); it++) {
		for (eit = it->entries.begin(); eit != it->entries.end(); )
		{
			bool added = false;
			if (doAttached) {
				if (eit->mExtraFlags & BITDHT_PEER_EXFLAG_ATTACHED) {
					/* add to send list, if we haven't pinged recently */
					if ((ts - eit->mLastSendTime > BITDHT_ATTACHED_SEND_PERIOD ) &&
						(ts - eit->mLastRecvTime > BITDHT_ATTACHED_SEND_PERIOD )) {
						peerIds.push_back(eit->mPeerId);
						eit->mLastSendTime = ts;
						added = true;
					}
					attachedCount++;
				}
			}
				

			/* timeout on last send time! */
			if ((!added) && (ts - eit->mLastSendTime > BITDHT_MAX_SEND_PERIOD )) {
				/* We want to ping a peer iff:
		 	 	 * 1) They are out-of-date: mLastRecvTime is too old.
			 	 * 2) They don't have 0x0001 flag (we haven't received a PONG) and never sent.
			 	 */
				if ((ts - eit->mLastRecvTime > BITDHT_MAX_SEND_PERIOD ) || 
					!(eit->mPeerFlags & BITDHT_PEER_STATUS_RECV_PONG)) {
					peerIds.push_back(eit->mPeerId);
					eit->mLastSendTime = ts;
				}
			}


			/* we also want to remove very old entries (should it happen here?) 
			 * which are not pushed out by newer entries (will happen in for closer buckets)
			 */

			bool discard = false;
			/* discard very old entries */
			if (ts - eit->mLastRecvTime > BITDHT_DISCARD_PERIOD) {
				discard = true;
			}
		
			/* discard peers which have not responded to anything (ie have no flags set) */
			/* changed into have not id'ed themselves, as we've added ping to list of flags. */
			if ((ts - eit->mFoundTime > BITDHT_MAX_RESPONSE_PERIOD ) &&
				!(eit->mPeerFlags & BITDHT_PEER_STATUS_RECV_PONG)) {
				discard = true;
			}
			

			/* INCREMENT */
			if (discard) {
				eit = it->entries.erase(eit);
			}
			else
			{
				eit++;
			}
		}
	}

#define ATTACH_UPDATE_PERIOD	600

	if ((ts - mAttachTS > ATTACH_UPDATE_PERIOD) || (attachedCount != mAttachedCount)) {
		//std::cerr << "Updating ATTACH Stuff";
		//std::cerr << std::endl;
		updateAttachedPeers(); /* XXX TEMP HACK to look at stability */
		mAttachTS = ts;
	}

	return (peerIds.size());
}